

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.c
# Opt level: O3

sexp_conflict
sexp_sendto(sexp_conflict ctx,sexp_conflict self,int sock,void *buffer,size_t len,int flags,
           sockaddr *addr,socklen_t addr_len,sexp_conflict timeout)

{
  sexp_conflict *ppsVar1;
  ssize_t sVar2;
  int *piVar3;
  
  sVar2 = sendto(sock,buffer,len,flags,(sockaddr *)addr,addr_len);
  if (((((sVar2 < 0) && (piVar3 = __errno_location(), timeout != (sexp_conflict)0x1)) &&
       (*piVar3 == 0xb)) &&
      (((((ulong)timeout & 3) != 0 || (timeout->tag != 0xb)) ||
       (((timeout->value).flonum != 0.0 || (NAN((timeout->value).flonum))))))) &&
     ((ppsVar1 = (((ctx->value).type.setters)->value).context.mark_stack[0xc].start,
      ((ulong)ppsVar1 & 3) == 0 && ((*(int *)ppsVar1 == 0x1b || (*(int *)ppsVar1 == 0x14)))))) {
    sexp_apply2(ctx,ppsVar1,(long)sock * 2 + 1,timeout);
    return (sexp_conflict)(((ctx->value).type.setters)->value).context.mark_stack[8].prev;
  }
  return (sexp_conflict)(sVar2 * 2 + 1);
}

Assistant:

sexp sexp_sendto (sexp ctx, sexp self, int sock, const void* buffer, size_t len, int flags, struct sockaddr* addr, socklen_t addr_len, sexp timeout) {
#if SEXP_USE_GREEN_THREADS
  sexp f;
#endif
  ssize_t res;
  res = sendto(sock, buffer, len, flags, addr, addr_len);
#if SEXP_USE_GREEN_THREADS
  if (res < 0 && errno == EWOULDBLOCK && !sexp_zerop(timeout)) {
    f = sexp_global(ctx, SEXP_G_THREADS_BLOCKER);
    if (sexp_applicablep(f)) {
      sexp_apply2(ctx, f, sexp_make_fixnum(sock), timeout);
      return sexp_global(ctx, SEXP_G_IO_BLOCK_ONCE_ERROR);
    }
  }
#endif
  return sexp_make_fixnum(res);
}